

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceName
          (VClient *this,uint i_DeviceIndex,string *o_rDeviceName,Enum *o_rDeviceType)

{
  pointer pVVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  Enum EVar5;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_64;
  unique_lock<boost::recursive_mutex> local_60;
  string local_50;
  
  uVar2 = (ulong)i_DeviceIndex;
  local_60.m = &this->m_FrameMutex;
  local_60.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_60);
  local_64 = Success;
  ClientUtils::Clear(o_rDeviceName);
  ClientUtils::Clear(o_rDeviceType);
  bVar3 = InitGet(this,&local_64);
  EVar5 = local_64;
  if (bVar3) {
    pVVar1 = (this->m_LatestFrame).m_Devices.
             super__Vector_base<ViconCGStream::VDeviceInfo,_std::allocator<ViconCGStream::VDeviceInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->m_LatestFrame).m_Devices.
                   super__Vector_base<ViconCGStream::VDeviceInfo,_std::allocator<ViconCGStream::VDeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) *
            0x6db6db6db6db6db7;
    EVar5 = InvalidIndex;
    if (uVar2 <= uVar4 && uVar4 - uVar2 != 0) {
      ClientUtils::AdaptDeviceName(&local_50,&pVVar1[uVar2].m_Name,pVVar1[uVar2].m_DeviceID);
      std::__cxx11::string::operator=((string *)o_rDeviceName,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      bVar3 = IsForcePlateDevice(this,pVVar1[uVar2].m_DeviceID);
      if (bVar3) {
        *o_rDeviceType = ForcePlate;
      }
      else {
        bVar3 = IsEyeTrackerDevice(this,pVVar1[uVar2].m_DeviceID);
        if (bVar3) {
          *o_rDeviceType = EyeTracker;
        }
        else {
          *o_rDeviceType = Unknown;
        }
      }
      EVar5 = Success;
    }
  }
  if (local_60.is_locked == true) {
    boost::recursive_mutex::unlock(local_60.m);
  }
  return EVar5;
}

Assistant:

Result::Enum VClient::GetDeviceName( const unsigned int       i_DeviceIndex,
                                           std::string      & o_rDeviceName,
                                           DeviceType::Enum & o_rDeviceType ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceName, o_rDeviceType ) )
  {
    return GetResult; 
  }

  if( i_DeviceIndex >= m_LatestFrame.m_Devices.size() )
  {
    return Result::InvalidIndex;
  }

  const ViconCGStream::VDeviceInfo & rDevice( m_LatestFrame.m_Devices[ i_DeviceIndex ] );
  o_rDeviceName = AdaptDeviceName( rDevice.m_Name, rDevice.m_DeviceID );
  if( IsForcePlateDevice( rDevice.m_DeviceID ) )
  {
    o_rDeviceType = DeviceType::ForcePlate;
  }
  else if( IsEyeTrackerDevice( rDevice.m_DeviceID ) )
  {
    o_rDeviceType = DeviceType::EyeTracker;
  }
  else
  {
    o_rDeviceType = DeviceType::Unknown;
  }

  return Result::Success;
}